

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_11.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
calculateFibonacci(vector<int,_std::allocator<int>_> *__return_storage_ptr__,int32_t n)

{
  size_type sVar1;
  int local_24;
  int local_20;
  int32_t next;
  int32_t current;
  int32_t prev;
  vector<int,_std::allocator<int>_> *pvStack_10;
  int32_t n_local;
  vector<int,_std::allocator<int>_> *fibonacciSeries;
  
  current._3_1_ = 0;
  prev = n;
  pvStack_10 = __return_storage_ptr__;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  next = 1;
  local_20 = 1;
  while (sVar1 = std::vector<int,_std::allocator<int>_>::size(__return_storage_ptr__),
        sVar1 != (long)prev) {
    local_24 = next + local_20;
    std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_24);
    next = local_20;
    local_20 = local_24;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int32_t> calculateFibonacci(int32_t n)
{
	std::vector<int32_t> fibonacciSeries;
	int32_t prev = 1;
	int32_t current = 1;
	while (fibonacciSeries.size() != n)
	{
		int32_t next = prev + current;
		fibonacciSeries.push_back(next);
		prev = current;
		current = next;
	}
	return fibonacciSeries;
}